

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O2

Vec4 __thiscall
tcu::ConstPixelBufferAccess::sample2DOffset
          (ConstPixelBufferAccess *this,Sampler *sampler,FilterMode filter,float s,float t,
          IVec3 *offset)

{
  WrapMode size;
  FilterMode size_00;
  WrapMode mode;
  WrapMode mode_00;
  int j;
  int iVar1;
  int k;
  int iVar2;
  undefined4 in_register_00000014;
  Sampler *sampler_00;
  int i;
  IVec3 *in_R8;
  bool bVar3;
  bool bVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined4 extraout_XMM0_Db;
  undefined8 extraout_XMM0_Qa;
  undefined4 in_XMM1_Db;
  undefined8 uVar8;
  Vector<float,_4> VVar9;
  Vec4 VVar10;
  Vec4 p11;
  Vec4 p01;
  Vec4 p10;
  Vec4 p00;
  float local_154;
  undefined1 local_110 [16];
  undefined1 local_100 [16];
  undefined1 local_f0 [16];
  undefined1 local_e0 [32];
  tcu local_c0 [16];
  tcu local_b0 [16];
  tcu local_a0 [16];
  tcu local_90 [16];
  tcu local_80 [16];
  tcu local_70 [16];
  tcu local_60 [16];
  tcu local_50 [16];
  tcu local_40 [16];
  undefined1 auVar11 [12];
  undefined8 uVar12;
  
  uVar8 = CONCAT44(in_XMM1_Db,t);
  sampler_00 = (Sampler *)CONCAT44(in_register_00000014,filter);
  local_154 = s;
  if (sampler_00->normalizedCoords == true) {
    local_154 = unnormalize(sampler_00->wrapS,s,sampler->wrapR);
    fVar5 = unnormalize(sampler_00->wrapT,t,sampler->minFilter);
    uVar8 = CONCAT44(extraout_XMM0_Db,fVar5);
  }
  if ((int)offset == 1) {
    size = sampler->wrapR;
    size_00 = sampler->minFilter;
    fVar5 = floorf(local_154 + -0.5);
    iVar1 = in_R8->m_data[0];
    iVar2 = in_R8->m_data[1];
    fVar6 = (float)uVar8 + -0.5;
    fVar7 = floorf(fVar6);
    mode = sampler_00->wrapS;
    j = wrap(mode,iVar1 + (int)fVar5,size);
    iVar1 = wrap(mode,iVar1 + (int)fVar5 + 1,size);
    mode_00 = sampler_00->wrapT;
    k = wrap(mode_00,iVar2 + (int)fVar7,size_00);
    iVar2 = wrap(mode_00,(int)fVar7 + iVar2 + 1,size_00);
    bVar3 = mode != CLAMP_TO_BORDER;
    bVar4 = mode_00 != CLAMP_TO_BORDER;
    i = (int)sampler;
    if ((bVar3 || j < (int)size && -1 < j) && (bVar4 || k < (int)size_00 && -1 < k)) {
      lookup((ConstPixelBufferAccess *)local_e0,i,j,k);
    }
    else {
      lookupBorder((tcu *)local_e0,(TextureFormat *)sampler,sampler_00);
    }
    if ((bVar4 || k < (int)size_00 && -1 < k) && (bVar3 || iVar1 < (int)size && -1 < iVar1)) {
      lookup((ConstPixelBufferAccess *)local_f0,i,iVar1,k);
    }
    else {
      lookupBorder((tcu *)local_f0,(TextureFormat *)sampler,sampler_00);
    }
    if ((bVar3 || j < (int)size && -1 < j) && (bVar4 || iVar2 < (int)size_00 && -1 < iVar2)) {
      lookup((ConstPixelBufferAccess *)local_100,i,j,iVar2);
    }
    else {
      lookupBorder((tcu *)local_100,(TextureFormat *)sampler,sampler_00);
    }
    if ((bVar3 || iVar1 < (int)size && -1 < iVar1) && (bVar4 || iVar2 < (int)size_00 && -1 < iVar2))
    {
      lookup((ConstPixelBufferAccess *)local_110,i,iVar1,iVar2);
    }
    else {
      lookupBorder((tcu *)local_110,(TextureFormat *)sampler,sampler_00);
    }
    fVar6 = fVar6 - fVar7;
    fVar5 = (local_154 + -0.5) - fVar5;
    tcu::operator*(local_70,1.0 - fVar5,(Vector<float,_4> *)local_e0);
    tcu::operator*(local_60,1.0 - fVar6,(Vector<float,_4> *)local_70);
    tcu::operator*(local_90,fVar5,(Vector<float,_4> *)local_f0);
    tcu::operator*(local_80,1.0 - fVar6,(Vector<float,_4> *)local_90);
    tcu::operator+(local_50,(Vector<float,_4> *)local_60,(Vector<float,_4> *)local_80);
    tcu::operator*(local_b0,1.0 - fVar5,(Vector<float,_4> *)local_100);
    tcu::operator*(local_a0,fVar6,(Vector<float,_4> *)local_b0);
    tcu::operator+(local_40,(Vector<float,_4> *)local_50,(Vector<float,_4> *)local_a0);
    tcu::operator*((tcu *)(local_e0 + 0x10),fVar5,(Vector<float,_4> *)local_110);
    tcu::operator*(local_c0,fVar6,(Vector<float,_4> *)(local_e0 + 0x10));
    VVar9 = tcu::operator+((tcu *)this,(Vector<float,_4> *)local_40,(Vector<float,_4> *)local_c0);
  }
  else if ((int)offset == 0) {
    VVar9.m_data = (float  [4])
                   sampleNearest2D((tcu *)this,(ConstPixelBufferAccess *)sampler,sampler_00,
                                   local_154,(float)uVar8,in_R8);
  }
  else {
    Vector<float,_4>::Vector((Vector<float,_4> *)this,0.0);
    VVar9.m_data[2] = (float)(int)uVar8;
    VVar9.m_data[3] = (float)(int)((ulong)uVar8 >> 0x20);
    VVar9.m_data[0] = (float)(int)extraout_XMM0_Qa;
    VVar9.m_data[1] = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  }
  VVar10.m_data[0] = VVar9.m_data[0];
  auVar11._4_4_ = VVar9.m_data[1];
  register0x00001240 = VVar9.m_data[2];
  register0x00001244 = VVar9.m_data[3];
  return (Vec4)VVar10.m_data;
}

Assistant:

Vec4 ConstPixelBufferAccess::sample2DOffset (const Sampler& sampler, Sampler::FilterMode filter, float s, float t, const IVec3& offset) const
{
	// check selected layer exists
	// \note offset.xy is the XY offset, offset.z is the selected layer
	DE_ASSERT(de::inBounds(offset.z(), 0, m_size.z()));

	// Non-normalized coordinates.
	float u = s;
	float v = t;

	if (sampler.normalizedCoords)
	{
		u = unnormalize(sampler.wrapS, s, m_size.x());
		v = unnormalize(sampler.wrapT, t, m_size.y());
	}

	switch (filter)
	{
		case Sampler::NEAREST:	return sampleNearest2D	(*this, sampler, u, v, offset);
		case Sampler::LINEAR:	return sampleLinear2D	(*this, sampler, u, v, offset);
		default:
			DE_ASSERT(DE_FALSE);
			return Vec4(0.0f);
	}
}